

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::FString(FString *this,char oneChar)

{
  if (oneChar == '\0') {
    NullString.RefCount = NullString.RefCount + 1;
    this->Chars = (char *)0x71deec;
  }
  else {
    AllocBuffer(this,1);
    *this->Chars = oneChar;
    this->Chars[1] = '\0';
  }
  return;
}

Assistant:

FString::FString (char oneChar)
{
	if (oneChar == '\0')
	{
		NullString.RefCount++;
		Chars = &NullString.Nothing[0];
	}
	else
	{
		AllocBuffer (1);
		Chars[0] = oneChar;
		Chars[1] = '\0';
	}
}